

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::writeQPDF(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  element_type *logger;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  Pipeline *pPVar5;
  shared_ptr<Pipeline> local_88;
  size_t local_78;
  size_t mem_usage;
  shared_ptr<Pipeline> local_60;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_50;
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_28;
  QPDF *local_18;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  local_18 = pdf;
  pdf_local = (QPDF *)this;
  bVar1 = createsOutput(this);
  if (bVar1) {
    QPDF::getLogger((QPDF *)&local_28);
    logger = std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::get(&local_28);
    bVar1 = Pl_Flate::zopfli_check_env(logger);
    std::shared_ptr<QPDFLogger>::~shared_ptr((shared_ptr<QPDFLogger> *)&local_28);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar2->warnings = true;
    }
  }
  bVar1 = createsOutput(this);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar2->split_pages == 0) {
      writeOutfile(this,local_18);
    }
    else {
      doSplitPages(this,local_18);
    }
  }
  else {
    doInspection(this,local_18);
  }
  QPDF::getWarnings(&local_50,local_18);
  bVar1 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::empty(&local_50);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_50);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar2->warnings = true;
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (((peVar2->warnings & 1U) != 0) &&
     (peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), (peVar2->suppress_warnings & 1U) == 0)) {
    bVar1 = createsOutput(this);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar2);
      QPDFLogger::getWarn((QPDFLogger *)&local_60,SUB81(peVar3,0));
      peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &local_60);
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pPVar5 = Pipeline::operator<<(peVar4,&peVar2->message_prefix);
      Pipeline::operator<<
                (pPVar5,
                 ": operation succeeded with warnings; resulting file may have some problems\n");
      std::shared_ptr<Pipeline>::~shared_ptr(&local_60);
    }
    else {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peVar2);
      QPDFLogger::getWarn((QPDFLogger *)&mem_usage,SUB81(peVar3,0));
      peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &mem_usage);
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pPVar5 = Pipeline::operator<<(peVar4,&peVar2->message_prefix);
      Pipeline::operator<<(pPVar5,": operation succeeded with warnings\n");
      std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&mem_usage);
    }
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->report_mem_usage & 1U) != 0) {
    local_78 = QUtil::get_max_memory_usage();
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )peVar2);
    QPDFLogger::getWarn((QPDFLogger *)&local_88,SUB81(peVar3,0));
    peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_88);
    pPVar5 = Pipeline::operator<<(peVar4,"qpdf-max-memory-usage ");
    pPVar5 = Pipeline::operator<<(pPVar5,local_78);
    Pipeline::operator<<(pPVar5,"\n");
    std::shared_ptr<Pipeline>::~shared_ptr(&local_88);
  }
  return;
}

Assistant:

void
QPDFJob::writeQPDF(QPDF& pdf)
{
    if (createsOutput()) {
        if (!Pl_Flate::zopfli_check_env(pdf.getLogger().get())) {
            m->warnings = true;
        }
    }
    if (!createsOutput()) {
        doInspection(pdf);
    } else if (m->split_pages) {
        doSplitPages(pdf);
    } else {
        writeOutfile(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
    if (m->warnings && (!m->suppress_warnings)) {
        if (createsOutput()) {
            *m->log->getWarn()
                << m->message_prefix
                << ": operation succeeded with warnings; resulting file may have some problems\n";
        } else {
            *m->log->getWarn() << m->message_prefix << ": operation succeeded with warnings\n";
        }
    }
    if (m->report_mem_usage) {
        // Call get_max_memory_usage before generating output. When debugging, it's easier if print
        // statements from get_max_memory_usage are not interleaved with the output.
        auto mem_usage = QUtil::get_max_memory_usage();
        *m->log->getWarn() << "qpdf-max-memory-usage " << mem_usage << "\n";
    }
}